

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

size_t ZSTD_hashPtr(void *p,U32 hBits,U32 mls)

{
  U32 mls_local;
  U32 hBits_local;
  void *p_local;
  
  switch(mls) {
  default:
    p_local = (void *)ZSTD_hash4Ptr(p,hBits);
    break;
  case 5:
    p_local = (void *)ZSTD_hash5Ptr(p,hBits);
    break;
  case 6:
    p_local = (void *)ZSTD_hash6Ptr(p,hBits);
    break;
  case 7:
    p_local = (void *)ZSTD_hash7Ptr(p,hBits);
    break;
  case 8:
    p_local = (void *)ZSTD_hash8Ptr(p,hBits);
  }
  return (size_t)p_local;
}

Assistant:

MEM_STATIC size_t ZSTD_hashPtr(const void* p, U32 hBits, U32 mls)
{
    switch(mls)
    {
    default:
    case 4: return ZSTD_hash4Ptr(p, hBits);
    case 5: return ZSTD_hash5Ptr(p, hBits);
    case 6: return ZSTD_hash6Ptr(p, hBits);
    case 7: return ZSTD_hash7Ptr(p, hBits);
    case 8: return ZSTD_hash8Ptr(p, hBits);
    }
}